

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize.cpp
# Opt level: O2

void __thiscall
CaDiCaL::Internal::calculate_minimize_chain
          (Internal *this,int lit,vector<int,_std::allocator<int>_> *stack)

{
  Flags FVar1;
  uint uVar2;
  pointer piVar3;
  pointer pFVar4;
  Clause *pCVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  pointer pVVar9;
  Clause *pCVar10;
  int idx;
  uint64_t id;
  uint local_4c;
  unsigned_long local_48;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_40;
  vector<int,_std::allocator<int>_> *local_38;
  
  iVar6 = -lit;
  if (0 < lit) {
    iVar6 = lit;
  }
  local_48 = CONCAT44(local_48._4_4_,iVar6);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(stack,(int *)&local_48);
  local_38 = &this->unit_analyzed;
  local_40 = &this->unit_chain;
  while (piVar3 = (stack->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish,
        (stack->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_start != piVar3) {
    local_4c = piVar3[-1];
    lVar7 = (long)(int)local_4c;
    (stack->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
         = piVar3 + -1;
    if (lVar7 < 0) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (&this->mini_chain,
                 (value_type_conflict5 *)
                 (this->vtab).super__Vector_base<CaDiCaL::Var,_std::allocator<CaDiCaL::Var>_>.
                 _M_impl.super__Vector_impl_data._M_start[-local_4c].reason);
    }
    else {
      pFVar4 = (this->ftab).super__Vector_base<CaDiCaL::Flags,_std::allocator<CaDiCaL::Flags>_>.
               _M_impl.super__Vector_impl_data._M_start;
      FVar1 = pFVar4[lVar7];
      if (((uint)FVar1 & 0x26) == 0) {
        pVVar9 = (this->vtab).super__Vector_base<CaDiCaL::Var,_std::allocator<CaDiCaL::Var>_>.
                 _M_impl.super__Vector_impl_data._M_start + lVar7;
        if (pVVar9->level == 0) {
          if (((uint)FVar1 & 1) == 0) {
            pFVar4[lVar7] = (Flags)((uint)FVar1 | 1);
            std::vector<int,_std::allocator<int>_>::push_back
                      (local_38,(value_type_conflict3 *)&local_4c);
            uVar2 = local_4c;
            if ((int)local_4c < 1) {
              uVar2 = -local_4c;
            }
            uVar8 = -local_4c;
            if ('\0' < this->vals[(int)local_4c]) {
              uVar8 = local_4c;
            }
            local_48 = (this->unit_clauses_idx).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start[(int)(uVar8 >> 0x1f | uVar2 << 1)];
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                      (local_40,&local_48);
          }
        }
        else {
          pFVar4[lVar7] = (Flags)((uint)FVar1 | 0x20);
          pCVar5 = pVVar9->reason;
          iVar6 = pCVar5->size;
          local_48 = CONCAT44(local_48._4_4_,-local_4c);
          std::vector<int,_std::allocator<int>_>::emplace_back<int>(stack,(int *)&local_48);
          for (pCVar10 = pVVar9->reason + 1;
              pCVar10 != (Clause *)((long)&pCVar5[1].field_0 + (long)iVar6 * 4);
              pCVar10 = (Clause *)((long)&pCVar10->field_0 + 4)) {
            uVar2 = *(uint *)&pCVar10->field_0;
            if (uVar2 != local_4c) {
              uVar8 = -uVar2;
              if (0 < (int)uVar2) {
                uVar8 = uVar2;
              }
              local_48 = CONCAT44(local_48._4_4_,uVar8);
              std::vector<int,_std::allocator<int>_>::emplace_back<int>(stack,(int *)&local_48);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Internal::calculate_minimize_chain (int lit, std::vector<int> &stack) {
  assert (stack.empty ());
  stack.push_back (vidx (lit));

  while (!stack.empty ()) {
    const int idx = stack.back ();
    assert (idx);
    stack.pop_back ();
    if (idx < 0) {
      Var &v = var (idx);
      mini_chain.push_back (v.reason->id);
      continue;
    }
    assert (idx);
    Flags &f = flags (idx);
    Var &v = var (idx);
    if (f.keep || f.added || f.poison) {
      continue;
    }
    if (!v.level) {
      if (f.seen)
        continue;
      f.seen = true;
      unit_analyzed.push_back (idx);
      const int lit = val (idx) > 0 ? idx : -idx;
      const unsigned uidx = vlit (lit); // I didn't clean added flag
      uint64_t id = unit_clauses (uidx);
      assert (id);
      unit_chain.push_back (id);
      continue;
    }
    f.added = true;
    assert (v.reason && f.removable);
    const const_literal_iterator end = v.reason->end ();
    const_literal_iterator i;
    LOG (v.reason, "LRAT chain for lit %d at depth %zd by going over", lit,
         stack.size ());
    stack.push_back (-idx);
    for (i = v.reason->begin (); i != end; i++) {
      const int other = *i;
      if (other == idx)
        continue;
      stack.push_back (vidx (other));
    }
  }
  assert (stack.empty ());
}